

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  secp256k1_gej *psVar9;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar10;
  secp256k1_fe *psVar11;
  bool bVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int vflag;
  secp256k1_fe sStack_2a0;
  secp256k1_fe sStack_278;
  secp256k1_fe sStack_250;
  secp256k1_fe sStack_220;
  secp256k1_fe sStack_1f8;
  secp256k1_fe sStack_1d0;
  code *pcStack_1a0;
  undefined4 local_18c;
  uint local_188;
  uint local_184;
  secp256k1_gej *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  uint64_t local_98;
  uint64_t local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  uint local_40;
  
  bVar13 = 0;
  a_00 = (secp256k1_gej *)local_b8;
  psVar9 = a;
  psVar10 = a_00;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (psVar10->x).n[0] = (psVar9->x).n[0];
    psVar9 = (secp256k1_gej *)((psVar9->x).n + 1);
    psVar10 = (secp256k1_gej *)((psVar10->x).n + 1);
  }
  auVar14._8_4_ = 0xffffffff;
  auVar14._0_8_ = 0xffffffffffffffff;
  auVar14._12_4_ = 0xffffffff;
  local_c8 = *(undefined1 (*) [16])(b->x).n;
  local_d8 = *(undefined1 (*) [16])((b->x).n + 2);
  local_f8 = local_c8 & ZEXT816(0) << 0x40 | local_b8._0_16_ & auVar14;
  local_128 = ZEXT816(0) << 0x40 & local_d8 | auVar14 & local_b8._16_16_;
  uVar1 = (b->x).n[4];
  uVar2 = (b->y).n[0];
  auVar15._8_4_ = 0xffffffff;
  auVar15._0_8_ = 0xffffffffffffffff;
  auVar15._12_4_ = 0xffffffff;
  local_e8 = *(undefined1 (*) [16])((b->y).n + 1);
  local_108 = *(undefined1 (*) [16])((b->y).n + 3);
  local_138 = local_e8 & ZEXT816(0) << 0x40 | local_88 & auVar15;
  local_158 = ZEXT816(0) << 0x40 & local_108 | auVar15 & local_78;
  local_18c = 0;
  auVar16._8_4_ = 0xffffffff;
  auVar16._0_8_ = 0xffffffffffffffff;
  auVar16._12_4_ = 0xffffffff;
  local_118 = *(undefined1 (*) [16])(b->z).n;
  local_148 = *(undefined1 (*) [16])((b->z).n + 2);
  local_168 = local_118 & ZEXT816(0) << 0x40 | local_68 & auVar16;
  local_178 = ZEXT816(0) << 0x40 & local_148 | auVar16 & local_58;
  uVar3 = (b->z).n[4];
  local_184 = local_40;
  local_188 = b->infinity;
  pcStack_1a0 = (code *)0x167b47;
  local_180 = b;
  local_b8._0_16_ = local_f8;
  local_b8._16_16_ = local_128;
  local_88 = local_138;
  local_78 = local_158;
  local_68 = local_168;
  local_58 = local_178;
  iVar6 = gej_xyz_equals_gej(a_00,a);
  if (iVar6 == 0) {
    pcStack_1a0 = (code *)0x167ce5;
    test_gej_cmov_cold_2();
  }
  else {
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    auVar17._12_4_ = 0xffffffff;
    local_b8._16_16_ = local_d8 & auVar17 | local_128 & ZEXT816(0) << 0x40;
    local_b8._0_16_ = local_c8 & auVar17 | local_f8 & ZEXT816(0) << 0x40;
    a_00 = (secp256k1_gej *)local_b8;
    auVar18._8_4_ = 0xffffffff;
    auVar18._0_8_ = 0xffffffffffffffff;
    auVar18._12_4_ = 0xffffffff;
    local_78 = local_108 & auVar18 | local_158 & ZEXT816(0) << 0x40;
    local_88 = local_e8 & auVar18 | local_138 & ZEXT816(0) << 0x40;
    local_18c = 1;
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    local_58 = local_148 & auVar19 | local_178 & ZEXT816(0) << 0x40;
    local_68 = local_118 & auVar19 | local_168 & ZEXT816(0) << 0x40;
    local_40 = local_184 & 0xfffffffe | local_188 & 1;
    pcStack_1a0 = (code *)0x167cca;
    a = local_180;
    local_98 = uVar1;
    local_90 = uVar2;
    local_48 = uVar3;
    iVar6 = gej_xyz_equals_gej(a_00,local_180);
    if (iVar6 != 0) {
      return;
    }
  }
  pcStack_1a0 = gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  if ((a_00->infinity != a->infinity) || (a_00->infinity != 0)) {
    return;
  }
  psVar11 = &sStack_220;
  pcStack_1a0 = (code *)uVar3;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar11->n[0] = (a_00->x).n[0];
    a_00 = (secp256k1_gej *)((long)a_00 + (ulong)bVar13 * -0x10 + 8);
    psVar11 = (secp256k1_fe *)((long)psVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  psVar11 = &sStack_2a0;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    psVar11->n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((long)a + (ulong)bVar13 * -0x10 + 8);
    psVar11 = (secp256k1_fe *)((long)psVar11 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  secp256k1_fe_impl_normalize(&sStack_220);
  secp256k1_fe_impl_normalize(&sStack_1f8);
  secp256k1_fe_impl_normalize(&sStack_1d0);
  secp256k1_fe_impl_normalize(&sStack_2a0);
  secp256k1_fe_impl_normalize(&sStack_278);
  secp256k1_fe_impl_normalize(&sStack_250);
  uVar7 = 4;
  do {
    uVar4 = sStack_2a0.n[uVar7];
    uVar5 = sStack_220.n[uVar7];
    if ((uVar5 >= uVar4 && uVar5 != uVar4) || (uVar5 < uVar4)) break;
    bVar12 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar12);
  uVar7 = 4;
  do {
    uVar4 = sStack_278.n[uVar7];
    uVar5 = sStack_1f8.n[uVar7];
    if ((uVar5 >= uVar4 && uVar5 != uVar4) || (uVar5 < uVar4)) break;
    bVar12 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar12);
  uVar7 = 4;
  do {
    if (sStack_1d0.n[uVar7] != sStack_250.n[uVar7]) {
      return;
    }
    bVar12 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar12);
  return;
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}